

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_plats.cpp
# Opt level: O3

void __thiscall DPlat::Tick(DPlat *this)

{
  int *piVar1;
  EPlatState EVar2;
  EPlatType EVar3;
  sector_t *sec;
  EMoveResult EVar4;
  int iVar5;
  
  EVar2 = this->m_Status;
  if (EVar2 == waiting) {
    if ((0 < this->m_Count) && (iVar5 = this->m_Count + -1, this->m_Count = iVar5, iVar5 == 0)) {
      sec = (this->super_DMovingFloor).super_DMover.super_DSectorEffect.m_Sector;
      this->m_Status = -(uint)(this->m_Low != (sec->floorplane).D) & down;
      if (this->m_Type == platToggle) {
        SN_StartSequence(sec,1,"Silence",0);
        return;
      }
LAB_00556bde:
      PlayPlatSound(this,"Platform");
      return;
    }
  }
  else if (EVar2 == down) {
    EVar4 = sector_t::MoveFloor((this->super_DMovingFloor).super_DMover.super_DSectorEffect.m_Sector
                                ,this->m_Speed,this->m_Low,-1,-1,false);
    if (EVar4 == crushed) {
      if ((this->m_Crush < 0) && (this->m_Type != platToggle)) {
        this->m_Status = up;
        this->m_Count = this->m_Wait;
        PlayPlatSound(this,"Platform");
      }
    }
    else if (EVar4 == pastdest) {
      SN_StopSequence((this->super_DMovingFloor).super_DMover.super_DSectorEffect.m_Sector,1);
      EVar3 = this->m_Type;
      if (EVar3 == platToggle) {
        this->m_OldStatus = this->m_Status;
        this->m_Status = in_stasis;
      }
      else {
        this->m_Count = this->m_Wait;
        this->m_Status = waiting;
        if ((EVar3 < platUpByValueStay) && ((0x58U >> (EVar3 & 0x1f) & 1) != 0)) {
          (*(this->super_DMovingFloor).super_DMover.super_DSectorEffect.super_DThinker.super_DObject
            ._vptr_DObject[4])(this);
        }
      }
    }
    if ((this->m_Type < (platRaiseAndStayLockout|platDownWaitUpStay)) &&
       ((0x1180U >> (this->m_Type & 0x1f) & 1) != 0)) {
LAB_00556d2e:
      (*(this->super_DMovingFloor).super_DMover.super_DSectorEffect.super_DThinker.super_DObject.
        _vptr_DObject[4])(this);
      return;
    }
  }
  else if (EVar2 == up) {
    EVar4 = sector_t::MoveFloor((this->super_DMovingFloor).super_DMover.super_DSectorEffect.m_Sector
                                ,this->m_Speed,this->m_High,this->m_Crush,1,false);
    if ((EVar4 == crushed) && (this->m_Crush == -1)) {
      this->m_Count = this->m_Wait;
      this->m_Status = down;
      goto LAB_00556bde;
    }
    if (EVar4 == pastdest) {
      SN_StopSequence((this->super_DMovingFloor).super_DMover.super_DSectorEffect.m_Sector,1);
      EVar3 = this->m_Type;
      if (EVar3 == platToggle) {
        this->m_OldStatus = this->m_Status;
        this->m_Status = in_stasis;
      }
      else {
        this->m_Count = this->m_Wait;
        this->m_Status = waiting;
        if (EVar3 < (platRaiseAndStayLockout|platDownWaitUpStay)) {
          if ((0xda6U >> (EVar3 & 0x1f) & 1) == 0) {
            if (EVar3 != platRaiseAndStayLockout) {
              return;
            }
            piVar1 = &((this->super_DMovingFloor).super_DMover.super_DSectorEffect.m_Sector)->planes
                      [0].Flags;
            *piVar1 = *piVar1 | 2;
          }
          goto LAB_00556d2e;
        }
      }
    }
  }
  return;
}

Assistant:

void DPlat::Tick ()
{
	EMoveResult res;
		
	switch (m_Status)
	{
	case up:
		res = m_Sector->MoveFloor (m_Speed, m_High, m_Crush, 1, false);
										
		if (res == EMoveResult::crushed && (m_Crush == -1))
		{
			m_Count = m_Wait;
			m_Status = down;
			PlayPlatSound ("Platform");
		}
		else if (res == EMoveResult::pastdest)
		{
			SN_StopSequence (m_Sector, CHAN_FLOOR);
			if (m_Type != platToggle)
			{
				m_Count = m_Wait;
				m_Status = waiting;

				switch (m_Type)
				{
					case platRaiseAndStayLockout:
						// Instead of keeping the dead thinker like Heretic did let's 
						// better use a flag to avoid problems elsewhere. For example,
						// keeping the thinker would make tagwait wait indefinitely.
						m_Sector->planes[sector_t::floor].Flags |= PLANEF_BLOCKED; 
					case platRaiseAndStay:
					case platDownByValue:
					case platDownWaitUpStay:
					case platDownWaitUpStayStone:
					case platUpByValueStay:
					case platDownToNearestFloor:
					case platDownToLowestCeiling:
						Destroy ();
						break;
					default:
						break;
				}
			}
			else
			{
				m_OldStatus = m_Status;		//jff 3/14/98 after action wait  
				m_Status = in_stasis;		//for reactivation of toggle
			}
		}
		break;
		
	case down:
		res = m_Sector->MoveFloor (m_Speed, m_Low, -1, -1, false);

		if (res == EMoveResult::pastdest)
		{
			SN_StopSequence (m_Sector, CHAN_FLOOR);
			// if not an instant toggle, start waiting
			if (m_Type != platToggle)		//jff 3/14/98 toggle up down
			{								// is silent, instant, no waiting
				m_Count = m_Wait;
				m_Status = waiting;

				switch (m_Type)
				{
					case platUpWaitDownStay:
					case platUpNearestWaitDownStay:
					case platUpByValue:
						Destroy ();
						break;
					default:
						break;
				}
			}
			else
			{	// instant toggles go into stasis awaiting next activation
				m_OldStatus = m_Status;		//jff 3/14/98 after action wait  
				m_Status = in_stasis;		//for reactivation of toggle
			}
		}
		else if (res == EMoveResult::crushed && m_Crush < 0 && m_Type != platToggle)
		{
			m_Status = up;
			m_Count = m_Wait;
			PlayPlatSound ("Platform");
		}

		//jff 1/26/98 remove the plat if it bounced so it can be tried again
		//only affects plats that raise and bounce

		// remove the plat if it's a pure raise type
		switch (m_Type)
		{
			case platUpByValueStay:
			case platRaiseAndStay:
			case platRaiseAndStayLockout:
				Destroy ();
			default:
				break;
		}

		break;
		
	case waiting:
		if (m_Count > 0 && !--m_Count)
		{
			if (m_Sector->floorplane.fD() == m_Low)
				m_Status = up;
			else
				m_Status = down;

			if (m_Type == platToggle)
				SN_StartSequence (m_Sector, CHAN_FLOOR, "Silence", 0);
			else
				PlayPlatSound ("Platform");
		}
		break;

	case in_stasis:
		break;
	}
}